

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Const *const_)

{
  float fVar1;
  ulong uVar2;
  byte bVar3;
  size_t sVar4;
  char *pcVar5;
  int i;
  int lane;
  char *format;
  char buf [128];
  
  switch((const_->type_).enum_) {
  case V128:
    Writef(this,"v128_const(0x%02x",(ulong)(const_->data_).v[0]);
    for (lane = 1; lane != 0x10; lane = lane + 1) {
      buf._0_8_ = *(undefined8 *)(const_->data_).v;
      buf._8_8_ = *(undefined8 *)((const_->data_).v + 8);
      bVar3 = v128::To<unsigned_char>((v128 *)buf,lane);
      Writef(this,", 0x%02x",(ulong)bVar3);
    }
    WriteData(this,")",1);
    return;
  case F64:
    uVar2 = *(ulong *)(const_->data_).v;
    if ((~uVar2 & 0x7ff0000000000000) != 0) {
      snprintf(buf,0x80,"%.17g",uVar2);
      pcVar5 = strchr(buf,0x2e);
      if ((pcVar5 == (char *)0x0) && (pcVar5 = strchr(buf,0x65), pcVar5 == (char *)0x0)) {
        sVar4 = strlen(buf);
        (buf + sVar4)[0] = '.';
        (buf + sVar4)[1] = '0';
        buf[sVar4 + 2] = '\0';
      }
      Writef(this,"%s",buf);
      return;
    }
    pcVar5 = "-";
    if (-1 < (long)uVar2) {
      pcVar5 = "";
    }
    if ((uVar2 & 0xfffffffffffff) != 0) {
      Writef(this,"f64_reinterpret_i64(0x%016lx) /* %snan:0x%013lx */");
      return;
    }
    break;
  case F32:
    fVar1 = *(float *)(const_->data_).v;
    if ((~(uint)fVar1 & 0x7f800000) != 0) {
      Writef(this,"%.9g",(double)fVar1);
      return;
    }
    pcVar5 = "-";
    if (-1 < (int)fVar1) {
      pcVar5 = "";
    }
    if (((uint)fVar1 & 0x7fffff) != 0) {
      Writef(this,"f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */");
      return;
    }
    break;
  case I64:
    pcVar5 = *(char **)(const_->data_).v;
    format = "%luull";
    goto LAB_00143678;
  case I32:
    Writef(this,"%uu",(ulong)*(uint *)(const_->data_).v);
    return;
  default:
    abort();
  }
  format = "%sINFINITY";
LAB_00143678:
  Writef(this,format,pcVar5);
  return;
}

Assistant:

explicit WrapperRef(const std::string& name)
      : GlobalName(ModuleFieldType::Func, name) {}